

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O0

MessageStore * __thiscall
FIX::MemoryStoreFactory::create(MemoryStoreFactory *this,UtcTimeStamp *now,SessionID *param_2)

{
  MemoryStore *this_00;
  SessionID *param_2_local;
  UtcTimeStamp *now_local;
  MemoryStoreFactory *this_local;
  
  this_00 = (MemoryStore *)operator_new(0x60);
  MemoryStore::MemoryStore(this_00,now);
  return &this_00->super_MessageStore;
}

Assistant:

MessageStore *MemoryStoreFactory::create(const UtcTimeStamp &now, const SessionID &) { return new MemoryStore(now); }